

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<Flood_One_Test>::CreateTest
          (TestFactoryImpl<Flood_One_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  *(undefined1 *)((long)&this_00[1]._vptr_Test + 4) = 0;
  *(undefined4 *)&this_00[1]._vptr_Test = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_00197c80;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }